

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObserver.cpp
# Opt level: O3

bool __thiscall test_CEObserver::test_set_atmoPars(test_CEObserver *this)

{
  undefined1 uVar1;
  long lVar2;
  double dVar3;
  double pres;
  double wavelength;
  double temp_F;
  double temp_C;
  double temp_K;
  double old_tol;
  CEObserver obs;
  allocator local_149;
  double local_148;
  undefined4 local_13c;
  string local_138;
  double local_118;
  double local_110;
  double local_108 [4];
  double local_e8;
  double local_e0;
  double local_d8;
  undefined8 local_d0;
  CEObserver local_c8;
  
  local_d0 = (**(code **)(*(long *)this + 0x20))();
  local_c8._vptr_CEObserver = (_func_int **)0x3da5fd7fe1796495;
  (**(code **)(*(long *)this + 0x30))(this);
  CEObserver::CEObserver(&local_c8,&this->base_obs_);
  local_d8 = CEObserver::Temperature_K(&local_c8);
  local_d8 = local_d8 + 10.0;
  local_e0 = CppEphem::Temp_K2C(&local_d8);
  local_e8 = CppEphem::Temp_K2F(&local_d8);
  CEObserver::SetTemperature_K(&local_c8,&local_d8);
  local_108[0] = CEObserver::Temperature_K(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",(allocator *)&local_148);
  local_118._0_4_ = 0xae;
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_d8,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_148);
  local_108[0] = CEObserver::Temperature_C(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",(allocator *)&local_148);
  local_118._0_4_ = 0xaf;
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_e0,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_148);
  local_108[0] = CEObserver::Temperature_F(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",(allocator *)&local_148);
  local_118._0_4_ = 0xb0;
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_e8,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_148);
  local_e8 = local_e8 + 10.0;
  CEObserver::SetTemperature_F(&local_c8,&local_e8);
  local_108[0] = CEObserver::Temperature_F(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",(allocator *)&local_148);
  local_118._0_4_ = 0xb5;
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_e8,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_148);
  local_e0 = local_e0 + -10.0;
  CEObserver::SetTemperature_C(&local_c8,&local_e0);
  local_108[0] = CEObserver::Temperature_C(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",(allocator *)&local_148);
  local_118 = (double)CONCAT44(local_118._4_4_,0xb8);
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_e0,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_148);
  dVar3 = CEObserver::Pressure_hPa(&local_c8);
  local_118 = dVar3 + 10.0;
  CEObserver::SetPressure_hPa(&local_c8,&local_118);
  local_108[0] = CEObserver::Pressure_hPa(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",(allocator *)&local_110);
  local_148 = (double)CONCAT44(local_148._4_4_,0xbd);
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_110);
  dVar3 = CEObserver::RelativeHumidity(&local_c8);
  local_148 = *(double *)(&DAT_00134098 + (ulong)(-(uint)(dVar3 == 0.25) & 1) * 8);
  CEObserver::SetRelativeHumidity(&local_c8,&local_148);
  local_108[0] = CEObserver::RelativeHumidity(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",(allocator *)&local_13c);
  local_110 = (double)CONCAT44(local_110._4_4_,199);
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_148,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_13c);
  dVar3 = CEObserver::Wavelength_um(&local_c8);
  local_110 = dVar3 + 10.0;
  CEObserver::SetWavelength_um(&local_c8,&local_110);
  local_108[0] = CEObserver::Wavelength_um(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"test_set_atmoPars",&local_149);
  local_13c = 0xcc;
  (**(code **)(*(long *)this + 0x58))(this,local_108,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_149);
  CEObserver::print_abi_cxx11_(&local_138,&local_c8);
  lVar2 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_108,"test_set_atmoPars",&local_149);
  local_13c = 0xcf;
  (**(code **)(*(long *)this + 0x48))(this,lVar2 != 0,local_108);
  std::__cxx11::string::~string((string *)local_108);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_149);
  std::__cxx11::string::~string((string *)&local_138);
  (**(code **)(*(long *)this + 0x30))(this,&local_d0);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CEObserver::~CEObserver(&local_c8);
  return (bool)uVar1;
}

Assistant:

bool test_CEObserver::test_set_atmoPars()
{
    // Cache the tolerance
    double old_tol(DblTol());
    SetDblTol(1.0e-11);

    // Create a copy with different values for testing
    CEObserver obs(base_obs_);

    // Test temperature
    double temp_K = obs.Temperature_K() + 10.0;
    double temp_C = CppEphem::Temp_K2C(temp_K);
    double temp_F = CppEphem::Temp_K2F(temp_K);
    obs.SetTemperature_K(temp_K);
    test_double(obs.Temperature_K(), temp_K, __func__, __LINE__);
    test_double(obs.Temperature_C(), temp_C, __func__, __LINE__);
    test_double(obs.Temperature_F(), temp_F, __func__, __LINE__);

    // Test Temperature setting
    temp_F += 10.0;
    obs.SetTemperature_F(temp_F);
    test_double(obs.Temperature_F(), temp_F, __func__, __LINE__);
    temp_C -= 10.0;
    obs.SetTemperature_C(temp_C);
    test_double(obs.Temperature_C(), temp_C, __func__, __LINE__);

    // Test pressure
    double pres = obs.Pressure_hPa() + 10.0;
    obs.SetPressure_hPa(pres);
    test_double(obs.Pressure_hPa(),  pres, __func__, __LINE__);

    // Test Relative humidity
    double relHumidity = obs.RelativeHumidity();
    if (relHumidity == 0.25) {
        relHumidity = 0.5;
    } else {
        relHumidity = 0.25;
    }
    obs.SetRelativeHumidity(relHumidity);
    test_double(obs.RelativeHumidity(),  relHumidity, __func__, __LINE__);
    
    // Test wavelength
    double wavelength = obs.Wavelength_um() + 10.0;
    obs.SetWavelength_um(wavelength);
    test_double(obs.Wavelength_um(), wavelength, __func__, __LINE__);

    // Make sure the print statement actually does something
    test(obs.print().size() > 0, __func__, __LINE__);

    // Reset the tolerance
    SetDblTol(old_tol);
    return pass();
}